

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope_guard.hpp
# Opt level: O1

void __thiscall
sg::detail::scope_guard<const_std::function<void_()>_&,_void>::~scope_guard
          (scope_guard<const_std::function<void_()>_&,_void> *this)

{
  _Any_data *p_Var1;
  undefined8 uVar2;
  
  if (this->m_active == true) {
    p_Var1 = (_Any_data *)this->m_callback;
    if (*(long *)(p_Var1 + 1) == 0) {
      uVar2 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar2);
    }
    (**(code **)((long)p_Var1 + 0x18))(p_Var1);
  }
  return;
}

Assistant:

sg::detail::scope_guard<Callback>::scope_guard::~scope_guard() noexcept  /*
need the extra injected-class-name here to make different compilers happy */
{
  if(m_active)
    m_callback();
}